

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void looplist(ident *id,char *list,uint *body,bool search)

{
  bool bVar1;
  int iVar2;
  undefined1 local_78 [8];
  tagval t;
  char *val;
  char *end;
  char *start;
  char *s;
  undefined1 local_40 [4];
  int n;
  identstack stack;
  bool search_local;
  uint *body_local;
  char *list_local;
  ident *id_local;
  
  stack.next._7_1_ = search;
  if (id->type == 4) {
    s._4_4_ = 0;
    start = list;
    do {
      bVar1 = parselist(&start,&end,&val,&listquotestart,&listquoteend);
      if (!bVar1) goto LAB_00145f5a;
      t._8_8_ = newstring(end,(long)val - (long)end);
      iVar2 = s._4_4_ + 1;
      if (s._4_4_ == 0) {
        s._4_4_ = iVar2;
        tagval::setstr((tagval *)local_78,(char *)t._8_8_);
        pusharg(id,(tagval *)local_78,(identstack *)local_40);
        id->flags = id->flags & 0xffffffdf;
      }
      else {
        if ((id->field_2).minval == 3) {
          s._4_4_ = iVar2;
          if ((id->field_4).args != (char *)0x0) {
            operator_delete__((id->field_4).args);
          }
        }
        else {
          (id->field_2).minval = 3;
          s._4_4_ = iVar2;
        }
        cleancode(id);
        id->field_4 = (anon_union_8_3_558327c1_for_ident_6)t._8_8_;
      }
      bVar1 = executebool(body);
    } while ((!bVar1) || ((stack.next._7_1_ & 1) == 0));
    intret(s._4_4_ + -1);
    stack.next._7_1_ = 0;
LAB_00145f5a:
    if ((stack.next._7_1_ & 1) != 0) {
      intret(-1);
    }
    if (s._4_4_ != 0) {
      poparg(id);
    }
  }
  else if (search) {
    intret(-1);
  }
  return;
}

Assistant:

void looplist(ident *id, const char *list, const uint *body, bool search)
{
    if(id->type!=ID_ALIAS) { if(search) intret(-1); return; }
    identstack stack;
    int n = 0;
    for(const char *s = list, *start, *end; parselist(s, start, end);)
    {
        char *val = newstring(start, end-start);
        if(n++)
        {
            if(id->valtype == VAL_STR) delete[] id->val.s;
            else id->valtype = VAL_STR;
            cleancode(*id);
            id->val.s = val;
        }
        else
        {
            tagval t;
            t.setstr(val);
            pusharg(*id, t, stack);
            id->flags &= ~IDF_UNKNOWN;
        }
        if(executebool(body) && search) { intret(n-1); search = false; break; }
    }
    if(search) intret(-1);
    if(n) poparg(*id);
}